

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_opengl.c
# Opt level: O0

void update_enabled_arrays(void)

{
  uint8 uVar1;
  int have;
  int want;
  int i;
  int highest_enabled;
  
  want = 0;
  for (have = 0; have < ctx->max_attrs; have = have + 1) {
    uVar1 = ctx->want_attr[have];
    if (uVar1 != ctx->have_attr[have]) {
      if (uVar1 == '\0') {
        (*ctx->glDisableVertexAttribArray)(have);
      }
      else {
        (*ctx->glEnableVertexAttribArray)(have);
      }
      ctx->have_attr[have] = uVar1;
    }
    if (uVar1 != '\0') {
      want = have + 1;
    }
  }
  ctx->max_attrs = want;
  return;
}

Assistant:

static void update_enabled_arrays(void)
{
    int highest_enabled = 0;
    int i;

    // Enable/disable vertex arrays to match our needs.
    // this happens to work in both ARB1 and GLSL, but if something alien
    //  shows up, we'll have to split these into profile*() functions.
    for (i = 0; i < ctx->max_attrs; i++)
    {
        const int want = (const int) ctx->want_attr[i];
        const int have = (const int) ctx->have_attr[i];
        if (want != have)
        {
            if (want)
                ctx->glEnableVertexAttribArray(i);
            else
                ctx->glDisableVertexAttribArray(i);
            ctx->have_attr[i] = want;
        } // if

        if (want)
            highest_enabled = i + 1;
    } // for

    ctx->max_attrs = highest_enabled;  // trim unneeded iterations next time.
}